

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_medium(t_heap<xemmai::t_object> *this,size_t a_size)

{
  t_object *ptVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_t a_size_local;
  t_heap<xemmai::t_object> *this_local;
  t_object *p;
  t_object *local_70;
  t_object *p_1;
  t_object *local_50;
  t_object *p_2;
  t_object *local_30;
  t_object *p_3;
  t_object *local_10;
  
  if (a_size < 0x101) {
    plVar2 = (long *)__tls_get_addr(&PTR_00133fc0);
    local_70 = (t_object *)*plVar2;
    if (local_70 == (t_object *)0x0) {
      local_70 = f_allocate_from<1ul,16384ul>(this,(t_of<1UL,_16384UL> *)(this + 0x88));
    }
    else {
      ptVar1 = local_70->v_next;
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_00133fc0);
      *puVar3 = ptVar1;
    }
    this_local = (t_heap<xemmai::t_object> *)local_70;
  }
  else if (a_size < 0x201) {
    plVar2 = (long *)__tls_get_addr(&PTR_00133f28);
    local_50 = (t_object *)*plVar2;
    if (local_50 == (t_object *)0x0) {
      local_50 = f_allocate_from<2ul,4096ul>(this,(t_of<2UL,_4096UL> *)(this + 0xb0));
    }
    else {
      ptVar1 = local_50->v_next;
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_00133f28);
      *puVar3 = ptVar1;
    }
    this_local = (t_heap<xemmai::t_object> *)local_50;
  }
  else if (a_size < 0x401) {
    plVar2 = (long *)__tls_get_addr(&PTR_00133d48);
    local_30 = (t_object *)*plVar2;
    if (local_30 == (t_object *)0x0) {
      local_30 = f_allocate_from<3ul,1024ul>(this,(t_of<3UL,_1024UL> *)(this + 0xd8));
    }
    else {
      ptVar1 = local_30->v_next;
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_00133d48);
      *puVar3 = ptVar1;
    }
    this_local = (t_heap<xemmai::t_object> *)local_30;
  }
  else if (a_size < 0x801) {
    plVar2 = (long *)__tls_get_addr(&PTR_00133fd8);
    local_10 = (t_object *)*plVar2;
    if (local_10 == (t_object *)0x0) {
      local_10 = f_allocate_from<4ul,256ul>(this,(t_of<4UL,_256UL> *)(this + 0x100));
    }
    else {
      ptVar1 = local_10->v_next;
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_00133fd8);
      *puVar3 = ptVar1;
    }
    this_local = (t_heap<xemmai::t_object> *)local_10;
  }
  else {
    this_local = (t_heap<xemmai::t_object> *)f_allocate_large(this,a_size);
  }
  return (t_object *)this_local;
}

Assistant:

constexpr T* t_heap<T>::f_allocate_medium(size_t a_size)
{
	if (a_size <= c_UNIT << 1) return f_allocate(v_of1);
	if (a_size <= c_UNIT << 2) return f_allocate(v_of2);
	if (a_size <= c_UNIT << 3) return f_allocate(v_of3);
	if (a_size <= c_UNIT << 4) return f_allocate(v_of4);
	return f_allocate_large(a_size);
}